

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffdrrg(fitsfile *fptr,char *ranges,int *status)

{
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  long lVar1;
  int *in_RDX;
  char *in_RSI;
  int *in_RDI;
  int unaff_retaddr;
  LONGLONG naxis2;
  long kk;
  long jj;
  long *rowarray;
  long nrows;
  long *maxrow;
  long *minrow;
  int ii;
  int nranges2;
  int nranges;
  char *cptr;
  int *in_stack_00000090;
  fitsfile *in_stack_00000098;
  long local_68;
  long *in_stack_ffffffffffffffa0;
  long *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  size_t __nmemb;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_30;
  int local_2c;
  char *local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (*in_RDX < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar2 = ffrdef(in_stack_00000098,in_stack_00000090), 0 < iVar2)) {
        return *in_RDX;
      }
    }
    else {
      ffmahd((fitsfile *)naxis2,unaff_retaddr,
             (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      ffpmsg((char *)0x121c37);
      *in_RDX = 0xeb;
      iVar2 = 0xeb;
    }
    else {
      local_2c = 1;
      local_28 = in_RSI;
      while (local_28 = strchr(local_28,0x2c), local_28 != (char *)0x0) {
        local_28 = local_28 + 1;
        local_2c = local_2c + 1;
      }
      __ptr = calloc((long)local_2c,8);
      __ptr_00 = calloc((long)local_2c,8);
      if ((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) {
        *in_RDX = 0x71;
        ffpmsg((char *)0x121cfa);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        iVar2 = *in_RDX;
      }
      else {
        ffrwrg((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),(LONGLONG)__ptr
               ,(int)((ulong)__ptr_00 >> 0x20),in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_RDX);
        if ((*in_RDX < 1) && (local_30 != 0)) {
          __nmemb = 0;
          for (iVar2 = 0; iVar2 < local_30; iVar2 = iVar2 + 1) {
            __nmemb = ((__nmemb + *(long *)((long)__ptr_00 + (long)iVar2 * 8)) -
                      *(long *)((long)__ptr + (long)iVar2 * 8)) + 1;
          }
          __ptr_01 = calloc(__nmemb,8);
          if (__ptr_01 == (void *)0x0) {
            *in_RDX = 0x71;
            ffpmsg((char *)0x121e13);
            iVar2 = *in_RDX;
          }
          else {
            local_68 = 0;
            for (iVar2 = 0; iVar2 < local_30; iVar2 = iVar2 + 1) {
              for (lVar1 = *(long *)((long)__ptr + (long)iVar2 * 8);
                  lVar1 <= *(long *)((long)__ptr_00 + (long)iVar2 * 8); lVar1 = lVar1 + 1) {
                *(long *)((long)__ptr_01 + local_68 * 8) = lVar1;
                local_68 = local_68 + 1;
              }
            }
            ffdrws((fitsfile *)nrows,rowarray,jj,(int *)kk);
            free(__ptr_01);
            free(__ptr_00);
            free(__ptr);
            iVar2 = *in_RDX;
          }
        }
        else {
          free(__ptr_00);
          free(__ptr);
          iVar2 = *in_RDX;
        }
      }
    }
  }
  else {
    iVar2 = *in_RDX;
  }
  return iVar2;
}

Assistant:

int ffdrrg(fitsfile *fptr,  /* I - FITS file pointer to table               */
           char *ranges,    /* I - ranges of rows to delete (1 = first)     */
           int *status)     /* IO - error status                            */
/*
 delete the ranges of rows from the table (1 = first row of table).

The 'ranges' parameter typically looks like:
    '10-20, 30 - 40, 55' or '50-'
and gives a list of rows or row ranges separated by commas.
*/
{
    char *cptr;
    int nranges, nranges2, ii;
    long *minrow, *maxrow, nrows, *rowarray, jj, kk;
    LONGLONG naxis2;
    
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrrg)");
        return(*status = NOT_TABLE);
    }

    /* the NAXIS2 keyword may not be up to date, so use the structure value */
    naxis2 = (fptr->Fptr)->numrows;

    /* find how many ranges were specified ( = no. of commas in string + 1) */
    cptr = ranges;
    for (nranges = 1; (cptr = strchr(cptr, ',')); nranges++)
        cptr++;
 
    minrow = calloc(nranges, sizeof(long));
    maxrow = calloc(nranges, sizeof(long));

    if (!minrow || !maxrow) {
        *status = MEMORY_ALLOCATION;
        ffpmsg("failed to allocate memory for row ranges (ffdrrg)");
        if (maxrow) free(maxrow);
        if (minrow) free(minrow);
        return(*status);
    }

    /* parse range list into array of range min and max values */
    ffrwrg(ranges, naxis2, nranges, &nranges2, minrow, maxrow, status);
    if (*status > 0 || nranges2 == 0) {
        free(maxrow);
        free(minrow);
        return(*status);
    }

    /* determine total number or rows to delete */
    nrows = 0;
    for (ii = 0; ii < nranges2; ii++) {
       nrows = nrows + maxrow[ii] - minrow[ii] + 1;
    }

    rowarray = calloc(nrows, sizeof(long));
    if (!rowarray) {
        *status = MEMORY_ALLOCATION;
        ffpmsg("failed to allocate memory for row array (ffdrrg)");
        return(*status);
    }

    for (kk = 0, ii = 0; ii < nranges2; ii++) {
       for (jj = minrow[ii]; jj <= maxrow[ii]; jj++) {
           rowarray[kk] = jj;
           kk++;
       }
    }

    /* delete the rows */
    ffdrws(fptr, rowarray, nrows, status);
    
    free(rowarray);
    free(maxrow);
    free(minrow);
    return(*status);
}